

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathParser.cpp
# Opt level: O1

bool __thiscall MathExpression::check(MathExpression *this)

{
  bool bVar1;
  
  bVar1 = CheckPostfix(&this->postfix,this->allowLabels);
  if ((bVar1) && (bVar1 = CExpressionCommandList::Load(&this->expList,&this->postfix), bVar1)) {
    this->checked = true;
    return true;
  }
  Logger::printError<std::__cxx11::wstring>(Error,L"Invalid expression \"%s\"",&this->originalText);
  return false;
}

Assistant:

bool MathExpression::check()
{
	if (CheckPostfix(postfix,allowLabels) == false)
	{
		Logger::printError(Logger::Error,L"Invalid expression \"%s\"",originalText);
		return false;
	}

	if (expList.Load(postfix) == false)
	{
		Logger::printError(Logger::Error,L"Invalid expression \"%s\"",originalText);
		return false;
	}
	
	checked = true;
	return true;
}